

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O0

void dirABYTE(void)

{
  int iVar1;
  int local_c [2];
  aint add;
  
  iVar1 = ParseExpressionNoSyntaxError(&lp,local_c);
  if (iVar1 == 0) {
    Error("ABYTE <offset> <bytes>: parsing <offset> failed",bp,SUPPRESS);
  }
  else {
    Relocation::checkAndWarn(false);
    getBytesWithCheck(local_c[0],0,false);
  }
  return;
}

Assistant:

static void dirABYTE() {
	aint add;
	if (ParseExpressionNoSyntaxError(lp, add)) {
		Relocation::checkAndWarn();
		getBytesWithCheck(add);
	} else {
		Error("ABYTE <offset> <bytes>: parsing <offset> failed", bp, SUPPRESS);
	}
}